

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_thread.c
# Opt level: O3

int nni_plat_thr_init(nni_plat_thr *thr,_func_void_void_ptr *fn,void *arg)

{
  int iVar1;
  
  thr->func = fn;
  thr->arg = arg;
  iVar1 = pthread_create(&thr->tid,(pthread_attr_t *)&nni_thrattr,nni_plat_thr_main,thr);
  return (uint)(iVar1 != 0) * 2;
}

Assistant:

int
nni_plat_thr_init(nni_plat_thr *thr, void (*fn)(void *), void *arg)
{
	int rv;

	thr->func = fn;
	thr->arg  = arg;

	// POSIX wants functions to return a void *, but we don't care.
	rv = pthread_create(&thr->tid, &nni_thrattr, nni_plat_thr_main, thr);
	if (rv != 0) {
		// nni_printf("pthread_create: %s",
		// strerror(rv));
		return (NNG_ENOMEM);
	}
	return (0);
}